

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O1

void __thiscall Assimp::MDLImporter::MDLImporter(MDLImporter *this)

{
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_008207b0;
  this->configFrameID = 0;
  (this->configPalette)._M_dataplus._M_p = (pointer)&(this->configPalette).field_2;
  (this->configPalette)._M_string_length = 0;
  (this->configPalette).field_2._M_local_buf[0] = '\0';
  this->mBuffer = (uchar *)0x0;
  this->iGSFileVersion = 0;
  this->pIOHandler = (IOSystem *)0x0;
  this->pScene = (aiScene *)0x0;
  this->iFileSize = 0;
  return;
}

Assistant:

MDLImporter::MDLImporter()
: configFrameID()
, mBuffer()
, iGSFileVersion()
, pIOHandler()
, pScene()
, iFileSize() {
    // empty
}